

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__bmp_parse_header(stbi__context *s,stbi__bmp_data *info)

{
  stbi_uc sVar1;
  stbi__uint32 sVar2;
  stbi__uint32 sVar3;
  int iVar4;
  stbi__uint32 sVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  sVar1 = stbi__get8(s);
  if ((sVar1 != 'B') || (sVar1 = stbi__get8(s), sVar1 != 'M')) {
    pcVar6 = "not BMP";
    goto LAB_00112860;
  }
  stbi__get32le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  sVar2 = stbi__get32le(s);
  info->offset = sVar2;
  sVar2 = stbi__get32le(s);
  info->hsz = sVar2;
  info->mr = 0;
  info->mg = 0;
  info->mb = 0;
  info->ma = 0;
  info->extra_read = 0xe;
  if (-1 < info->offset) {
    if (sVar2 == 0xc) {
      sVar3 = stbi__get16le(s);
      s->img_x = sVar3;
      sVar3 = stbi__get16le(s);
    }
    else {
      if ((((sVar2 != 0x28) && (sVar2 != 0x38)) && (sVar2 != 0x6c)) && (sVar2 != 0x7c)) {
        pcVar6 = "unknown BMP";
        goto LAB_00112860;
      }
      sVar3 = stbi__get32le(s);
      s->img_x = sVar3;
      sVar3 = stbi__get32le(s);
    }
    s->img_y = sVar3;
    iVar4 = stbi__get16le(s);
    if (iVar4 == 1) {
      iVar4 = stbi__get16le(s);
      info->bpp = iVar4;
      if (sVar2 == 0xc) {
        return (void *)0x1;
      }
      sVar3 = stbi__get32le(s);
      if (sVar3 - 1 < 2) {
        pcVar6 = "BMP RLE";
        goto LAB_00112860;
      }
      if (3 < (int)sVar3) {
        pcVar6 = "BMP JPEG/PNG";
        goto LAB_00112860;
      }
      if (((sVar3 != 3) || (info->bpp == 0x10)) || (info->bpp == 0x20)) {
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        if (sVar2 != 0x28) {
          if ((sVar2 == 0x7c) || (sVar2 == 0x6c)) {
            sVar5 = stbi__get32le(s);
            info->mr = sVar5;
            sVar5 = stbi__get32le(s);
            info->mg = sVar5;
            sVar5 = stbi__get32le(s);
            info->mb = sVar5;
            sVar5 = stbi__get32le(s);
            info->ma = sVar5;
            if (sVar3 != 3) {
              stbi__bmp_set_mask_defaults(info,sVar3);
            }
            stbi__get32le(s);
            iVar4 = 0xc;
            while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
              stbi__get32le(s);
            }
            if (sVar2 != 0x6c) {
              if (sVar2 != 0x7c) {
                return (void *)0x0;
              }
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              return (void *)0x1;
            }
            return (void *)0x1;
          }
          if (sVar2 != 0x38) goto LAB_0011297f;
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
        }
        if ((info->bpp != 0x20) && (info->bpp != 0x10)) {
          return (void *)0x1;
        }
        if (sVar3 == 0) {
          stbi__bmp_set_mask_defaults(info,0);
          return (void *)0x1;
        }
        if (sVar3 == 3) {
          sVar2 = stbi__get32le(s);
          info->mr = sVar2;
          sVar2 = stbi__get32le(s);
          info->mg = sVar2;
          sVar2 = stbi__get32le(s);
          info->mb = sVar2;
          info->extra_read = info->extra_read + 0xc;
          if (info->mg != sVar2 || info->mr != info->mg) {
            return (void *)0x1;
          }
        }
      }
    }
  }
LAB_0011297f:
  pcVar6 = "bad BMP";
LAB_00112860:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar6;
  return (void *)0x0;
}

Assistant:

static void *stbi__bmp_parse_header(stbi__context *s, stbi__bmp_data *info)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') return stbi__errpuc("not BMP", "Corrupt BMP");
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   info->offset = stbi__get32le(s);
   info->hsz = hsz = stbi__get32le(s);
   info->mr = info->mg = info->mb = info->ma = 0;
   info->extra_read = 14;

   if (info->offset < 0) return stbi__errpuc("bad BMP", "bad BMP");

   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) return stbi__errpuc("unknown BMP", "BMP type not supported: unknown");
   if (hsz == 12) {
      s->img_x = stbi__get16le(s);
      s->img_y = stbi__get16le(s);
   } else {
      s->img_x = stbi__get32le(s);
      s->img_y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) return stbi__errpuc("bad BMP", "bad BMP");
   info->bpp = stbi__get16le(s);
   if (hsz != 12) {
      int compress = stbi__get32le(s);
      if (compress == 1 || compress == 2) return stbi__errpuc("BMP RLE", "BMP type not supported: RLE");
      if (compress >= 4) return stbi__errpuc("BMP JPEG/PNG", "BMP type not supported: unsupported compression"); // this includes PNG/JPEG modes
      if (compress == 3 && info->bpp != 16 && info->bpp != 32) return stbi__errpuc("bad BMP", "bad BMP"); // bitfields requires 16 or 32 bits/pixel
      stbi__get32le(s); // discard sizeof
      stbi__get32le(s); // discard hres
      stbi__get32le(s); // discard vres
      stbi__get32le(s); // discard colorsused
      stbi__get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
         }
         if (info->bpp == 16 || info->bpp == 32) {
            if (compress == 0) {
               stbi__bmp_set_mask_defaults(info, compress);
            } else if (compress == 3) {
               info->mr = stbi__get32le(s);
               info->mg = stbi__get32le(s);
               info->mb = stbi__get32le(s);
               info->extra_read += 12;
               // not documented, but generated by photoshop and handled by mspaint
               if (info->mr == info->mg && info->mg == info->mb) {
                  // ?!?!?
                  return stbi__errpuc("bad BMP", "bad BMP");
               }
            } else
               return stbi__errpuc("bad BMP", "bad BMP");
         }
      } else {
         // V4/V5 header
         int i;
         if (hsz != 108 && hsz != 124)
            return stbi__errpuc("bad BMP", "bad BMP");
         info->mr = stbi__get32le(s);
         info->mg = stbi__get32le(s);
         info->mb = stbi__get32le(s);
         info->ma = stbi__get32le(s);
         if (compress != 3) // override mr/mg/mb unless in BI_BITFIELDS mode, as per docs
            stbi__bmp_set_mask_defaults(info, compress);
         stbi__get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            stbi__get32le(s); // discard color space parameters
         if (hsz == 124) {
            stbi__get32le(s); // discard rendering intent
            stbi__get32le(s); // discard offset of profile data
            stbi__get32le(s); // discard size of profile data
            stbi__get32le(s); // discard reserved
         }
      }
   }
   return (void *) 1;
}